

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O0

bool IsKeyword(string *keyword)

{
  __type _Var1;
  int local_20;
  int i;
  int length;
  string *keyword_local;
  
  local_20 = 0;
  while( true ) {
    if (9 < local_20) {
      return false;
    }
    _Var1 = std::operator==(keyword,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(KeyWord_abi_cxx11_ + (long)local_20 * 0x20));
    if (_Var1) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

bool IsKeyword(string keyword) {
    //int length = KeyWord->size();  //Wrong!
    int length = sizeof(KeyWord) / sizeof(KeyWord[0]);
    for (int i = 0; i < length; i++) {
        if (keyword == KeyWord[i])
            return true;
    }
    return false;
}